

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_array_start(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  int *more_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  if ((buf == end) || (*buf != '[')) {
    *more = 0;
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x16);
  }
  else {
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_space(ctx,buf + 1,end);
    if ((ctx_local == (flatcc_json_parser_t *)end) || (*(char *)&ctx_local->ctx != ']')) {
      *more = 1;
    }
    else {
      *more = 0;
      ctx_local = (flatcc_json_parser_t *)
                  flatcc_json_parser_space(ctx,(char *)((long)&ctx_local->ctx + 1),end);
    }
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_array_start(flatcc_json_parser_t *ctx, const char *buf, const char *end, int *more)
{
    if (buf == end || *buf != '[') {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_expected_array);
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf != end && *buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
    *more = 1;
    return buf;
}